

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall Engine::Engine(Engine *this)

{
  Engine *this_local;
  
  std::vector<CallArgs_*,_std::allocator<CallArgs_*>_>::vector(&this->callStack);
  this->variables = (Variable **)0x0;
  this->variablesCount = 0;
  this->localFunctions = (LocalFunction **)0x0;
  this->localFunctionsCount = 0;
  this->currentScript = (ScriptBlock *)0x0;
  this->callStackPointer = 0;
  return;
}

Assistant:

Engine::Engine() {
	this->variables = nullptr;
	this->variablesCount = 0;
	this->localFunctions = nullptr;
	this->localFunctionsCount = 0;
	this->currentScript = nullptr;
	this->callStackPointer = 0;
}